

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O3

gc_heap_ptr<mjs::regexp_object> __thiscall
mjs::anon_unknown_35::to_regexp_object
          (anon_unknown_35 *this,gc_heap_ptr<mjs::global_object> *global,value *regexp)

{
  uint uVar1;
  gc_heap *this_00;
  bool bVar2;
  gc_heap *pgVar3;
  gc_heap *extraout_RAX;
  void *pvVar4;
  uint *puVar5;
  gc_heap *extraout_RAX_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_01;
  undefined8 uVar6;
  gc_heap_ptr<mjs::regexp_object> gVar7;
  gc_heap_ptr<mjs::regexp_object> gVar8;
  gc_heap_ptr_untyped local_40;
  ulong local_30;
  uint *local_28;
  undefined8 extraout_RDX_00;
  
  if (regexp->type_ == object) {
    bVar2 = gc_heap_ptr_untyped::has_type<mjs::regexp_object>
                      ((gc_heap_ptr_untyped *)&(regexp->field_1).s_);
    if (bVar2) {
      this_00 = (regexp->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                heap_;
      *(gc_heap **)this = this_00;
      uVar1 = *(uint *)((long)&regexp->field_1 + 8);
      pgVar3 = (gc_heap *)(ulong)uVar1;
      *(uint *)(this + 8) = uVar1;
      uVar6 = extraout_RDX;
      if (this_00 != (gc_heap *)0x0) {
        gc_heap::attach(this_00,(gc_heap_ptr_untyped *)this);
        gVar7.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX_00;
        gVar7.super_gc_heap_ptr_untyped.heap_ = extraout_RAX;
        return (gc_heap_ptr<mjs::regexp_object>)gVar7.super_gc_heap_ptr_untyped;
      }
      goto LAB_0017303c;
    }
  }
  pvVar4 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  to_string((mjs *)&local_40,*(gc_heap **)((long)pvVar4 + 8),regexp);
  puVar5 = (uint *)gc_heap_ptr_untyped::get(&local_40);
  local_28 = puVar5 + 1;
  local_30 = (ulong)*puVar5;
  regexp_object::make((gc_heap_ptr<mjs::global_object> *)this,(wstring_view *)global,
                      (regexp_flag)&local_30);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
  pgVar3 = extraout_RAX_00;
  uVar6 = extraout_RDX_01;
LAB_0017303c:
  gVar8.super_gc_heap_ptr_untyped._8_8_ = uVar6;
  gVar8.super_gc_heap_ptr_untyped.heap_ = pgVar3;
  return (gc_heap_ptr<mjs::regexp_object>)gVar8.super_gc_heap_ptr_untyped;
}

Assistant:

gc_heap_ptr<regexp_object> to_regexp_object(const gc_heap_ptr<global_object>& global, const value& regexp) {
    if (regexp.type() == value_type::object) {
        const auto& o = regexp.object_value();
        if (o.has_type<regexp_object>()) {
            return gc_heap_ptr<regexp_object>{o};
        }
    }
    auto& h = global->heap();
    return regexp_object::make(global, to_string(h, regexp).view(), regexp_flag::none);
}